

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  mbedtls_ct_uint_t mVar11;
  uint uVar12;
  ulong uVar13;
  uchar buf [1024];
  byte local_438 [11];
  undefined1 local_42d [1021];
  
  sVar1 = ctx->len;
  iVar4 = -0x4080;
  if (0xfffffffffffffc0e < sVar1 - 0x401 && ctx->padding == 0) {
    iVar4 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,local_438);
    if (iVar4 == 0) {
      uVar8 = sVar1 - 0xb;
      uVar13 = local_438[1] ^ mbedtls_ct_zero ^ 2;
      sVar9 = 2;
      uVar5 = 0;
      mVar11 = mbedtls_ct_zero;
      do {
        uVar6 = 0xffffffffffffffff;
        if ((long)(-((local_438[sVar9] ^ mbedtls_ct_zero) >> 1) |
                  -(local_438[sVar9] ^ mbedtls_ct_zero)) < 0) {
          uVar6 = mVar11;
        }
        uVar5 = uVar5 + (~(uint)uVar6 & 1);
        sVar9 = sVar9 + 1;
        mVar11 = uVar6;
      } while (sVar1 != sVar9);
      sVar9 = output_max_len;
      if (uVar8 < output_max_len) {
        sVar9 = uVar8;
      }
      uVar10 = (long)(-(mbedtls_ct_zero >> 1) | -(uVar5 >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
      uVar13 = (long)(-(uVar13 >> 1) |
                      -uVar13 | -((local_438[0] ^ mbedtls_ct_zero) >> 1) |
                                -(local_438[0] ^ mbedtls_ct_zero) |
                     -(mbedtls_ct_zero >> 1) |
                     -((uVar10 & mbedtls_ct_zero |
                       ~(mbedtls_ct_zero ^ uVar10) &
                       (mbedtls_ct_zero ^ uVar5) - (mbedtls_ct_zero ^ 8)) >> 0x3f ^ mbedtls_ct_zero)
                     ) >> 0x3f | ~uVar6;
      uVar2 = (uint)mbedtls_ct_zero;
      uVar3 = (uint)uVar13;
      uVar7 = uVar3 & (uint)sVar9 | ~(uVar2 ^ uVar3) & ((int)sVar1 - (int)uVar5) - 3U;
      uVar5 = (long)(-(mbedtls_ct_zero >> 1) | -(sVar9 >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
      uVar5 = -(mbedtls_ct_zero >> 1) |
              -((uVar5 & mbedtls_ct_zero |
                ~(mbedtls_ct_zero ^ uVar5) & (mbedtls_ct_zero ^ sVar9) - (uVar7 ^ mbedtls_ct_zero))
                >> 0x3f ^ mbedtls_ct_zero);
      mbedtls_ct_zeroize_if((long)uVar5 >> 0x3f | uVar13,local_42d,uVar8);
      uVar12 = (uint)((long)uVar5 >> 0x3f);
      uVar8 = (ulong)(~((uint)mbedtls_ct_zero ^ uVar12) & uVar7 | (uint)sVar9 & uVar12);
      mbedtls_ct_memmove_left(local_438 + (sVar1 - sVar9),sVar9,sVar9 - uVar8);
      if (output_max_len != 0) {
        switchD_00b03519::default(output,local_438 + (sVar1 - sVar9),sVar9);
      }
      iVar4 = -(uVar3 & 0x4100 | uVar12 & ~(uVar2 ^ uVar3) & 0x4400);
      *olen = uVar8;
    }
    mbedtls_platform_zeroize(local_438,0x400);
  }
  return iVar4;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng,
                                        size_t *olen,
                                        const unsigned char *input,
                                        unsigned char *output,
                                        size_t output_max_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t ilen;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    ilen = ctx->len;

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ilen < 16 || ilen > sizeof(buf)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    ret = mbedtls_rsa_private(ctx, f_rng, p_rng, input, buf);

    if (ret != 0) {
        goto cleanup;
    }

    ret = mbedtls_ct_rsaes_pkcs1_v15_unpadding(buf, ilen,
                                               output, output_max_len, olen);

cleanup:
    mbedtls_platform_zeroize(buf, sizeof(buf));

    return ret;
}